

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O2

QString * QIBusPlatformInputContextPrivate::getSocketPath(void)

{
  Data *pDVar1;
  char *pcVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  qsizetype qVar8;
  QDebug *pQVar9;
  QString *path;
  QArrayDataPointer<char16_t> *in_RDI;
  uint uVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_2d0;
  QArrayDataPointer<char16_t> local_2b8;
  QArrayDataPointer<char> local_2a0;
  QArrayDataPointer<char16_t> local_288;
  QStringBuilder<QString,_QLatin1String> local_268;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> local_240;
  QArrayDataPointer<char> local_208;
  QArrayDataPointer<char> local_1e8;
  QArrayDataPointer<char> local_1c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>
  local_1b0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  local_170;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>
  local_118;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c8.d._0_4_ = 0;
  local_1c8.d._4_4_ = 0;
  local_1c8.ptr._0_4_ = 0;
  local_1c8.ptr._4_4_ = 0;
  local_1c8.size = 0;
  local_1e8.size = -0x5555555555555556;
  local_1e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_1e8,"0",-1);
  in_RDI->size = -0x5555555555555556;
  in_RDI->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)in_RDI);
  if (in_RDI->ptr == (char16_t *)0x0) {
    qgetenv((char *)&local_b8);
    uVar4 = local_b8.a.a.a.a.a.a.d.d._0_4_;
    uVar5 = local_b8.a.a.a.a.a.a.d.d._4_4_;
    uVar6 = local_b8.a.a.a.a.a.a.d.ptr._0_4_;
    uVar7 = local_b8.a.a.a.a.a.a.d.ptr._4_4_;
    local_b8.a.a.a.a.a.a.d.d._0_4_ = local_1c8.d._0_4_;
    local_b8.a.a.a.a.a.a.d.d._4_4_ = local_1c8.d._4_4_;
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = local_1c8.ptr._0_4_;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = local_1c8.ptr._4_4_;
    lVar3 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
    local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1c8.size;
    local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1c8.size >> 0x20);
    local_1c8.size = lVar3;
    local_1c8.d._0_4_ = uVar4;
    local_1c8.d._4_4_ = uVar5;
    local_1c8.ptr._0_4_ = uVar6;
    local_1c8.ptr._4_4_ = uVar7;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    qVar8 = local_1c8.size;
    if (local_1c8.size == 0) {
      qgetenv((char *)&local_b8);
      uVar4 = local_b8.a.a.a.a.a.a.d.d._0_4_;
      uVar5 = local_b8.a.a.a.a.a.a.d.d._4_4_;
      uVar6 = local_b8.a.a.a.a.a.a.d.ptr._0_4_;
      uVar7 = local_b8.a.a.a.a.a.a.d.ptr._4_4_;
      local_b8.a.a.a.a.a.a.d.d._0_4_ = local_1c8.d._0_4_;
      local_b8.a.a.a.a.a.a.d.d._4_4_ = local_1c8.d._4_4_;
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = local_1c8.ptr._0_4_;
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = local_1c8.ptr._4_4_;
      lVar3 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
      local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1c8.size;
      local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1c8.size >> 0x20);
      local_1c8.size = lVar3;
      local_1c8.d._0_4_ = uVar4;
      local_1c8.d._4_4_ = uVar5;
      local_1c8.ptr._0_4_ = uVar6;
      local_1c8.ptr._4_4_ = uVar7;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    local_208.size = -0x5555555555555556;
    local_208.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_208.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_208,"unix",-1);
    if (qVar8 == 0) {
      qVar8 = QByteArray::indexOf((QByteArray *)&local_1c8,':',0);
      uVar10 = (uint)qVar8;
      if (0 < (int)uVar10) {
        QByteArray::left((QByteArray *)&local_b8,(QByteArray *)&local_1c8,
                         (ulong)(uVar10 & 0x7fffffff));
        pDVar1 = (Data *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
        pcVar2 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,local_b8.a.a.a.a.a.a.d.ptr._0_4_)
        ;
        local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_208.d,0);
        local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_208.d >> 0x20);
        local_b8.a.a.a.a.a.a.d.ptr._0_4_ = SUB84(local_208.ptr,0);
        local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_208.ptr >> 0x20);
        qVar8 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
        local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_208.size;
        local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_208.size >> 0x20);
        local_208.d = pDVar1;
        local_208.ptr = pcVar2;
        local_208.size = qVar8;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
      }
      QByteArray::indexOf((QByteArray *)&local_1c8,'.',(long)(int)(uVar10 + 1));
      QByteArray::mid((longlong)&local_b8,(longlong)&local_1c8);
      pDVar1 = (Data *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
      pcVar2 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,local_b8.a.a.a.a.a.a.d.ptr._0_4_);
      local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_1e8.d,0);
      local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_1e8.d >> 0x20);
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = SUB84(local_1e8.ptr,0);
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_1e8.ptr >> 0x20);
      qVar8 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
      local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1e8.size;
      local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1e8.size >> 0x20);
      local_1e8.d = pDVar1;
      local_1e8.ptr = pcVar2;
      local_1e8.size = qVar8;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    }
    else {
      QByteArray::operator=((QByteArray *)&local_1e8,(QByteArray *)&local_1c8);
    }
    lcQpaInputMethods();
    if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_b8.a.a.a.a.a.a.d.d._0_4_ = 2;
      local_b8.a.a.a.a.a.a.d.d._4_4_ = 0;
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = 0;
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = 0;
      local_b8.a.a.a.a.a.a.d.size._0_4_ = 0;
      local_b8.a.a.a.a.a.a.d.size._4_4_ = 0;
      local_b8.a.a.a.a.a.b.m_size = (qsizetype)lcQpaInputMethods::category.name;
      QMessageLogger::debug();
      pQVar9 = QDebug::operator<<((QDebug *)&local_118,"host=");
      pQVar9 = QDebug::operator<<(pQVar9,(QByteArray *)&local_208);
      pQVar9 = QDebug::operator<<(pQVar9,"displayNumber");
      QDebug::operator<<(pQVar9,(QByteArray *)&local_1e8);
      QDebug::~QDebug((QDebug *)&local_118);
    }
    QStandardPaths::writableLocation((StandardLocation)&local_288);
    local_268.a.d.size = local_288.size;
    local_268.a.d.ptr = local_288.ptr;
    local_268.a.d.d = local_288.d;
    local_288.d = (Data *)0x0;
    local_288.ptr = (char16_t *)0x0;
    local_288.size = 0;
    local_268.b.m_size = 10;
    local_268.b.m_data = "/ibus/bus/";
    QDBusConnection::localMachineId();
    QStringBuilder<QString,_QLatin1String>::QStringBuilder(&local_240.a,&local_268);
    local_240.b.m_size = local_2a0.size;
    local_240.b.m_data = local_2a0.ptr;
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>::QStringBuilder
              (&local_1b0.a,&local_240);
    local_1b0.b = L'-';
    QString::fromLocal8Bit<void>((QString *)&local_2b8,(QByteArray *)&local_208);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::QStringBuilder(&local_170,&local_1b0,(QString *)&local_2b8);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::QStringBuilder(&local_118.a,&local_170);
    local_118.b = L'-';
    QString::fromLocal8Bit<void>((QString *)&local_2d0,(QByteArray *)&local_1e8);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
    ::QStringBuilder(&local_b8,&local_118,(QString *)&local_2d0);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
    ::convertTo<QString>((QString *)in_RDI,&local_b8);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
    ::~QStringBuilder(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d0);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::~QStringBuilder(&local_118.a);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::~QStringBuilder(&local_170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_240);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_2a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_268);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_208);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1e8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QIBusPlatformInputContextPrivate::getSocketPath()
{
    QByteArray display;
    QByteArray displayNumber = "0";
    bool isWayland = false;

    if (QString path = qEnvironmentVariable("IBUS_ADDRESS_FILE"); !path.isNull()) {
        return path;
    } else if (display = qgetenv("WAYLAND_DISPLAY"); !display.isEmpty()) {
        isWayland = true;
    } else {
        display = qgetenv("DISPLAY");
    }
    QByteArray host = "unix";

    if (isWayland) {
        displayNumber = display;
    } else {
        int pos = display.indexOf(':');
        if (pos > 0)
            host = display.left(pos);
        ++pos;
        int pos2 = display.indexOf('.', pos);
        if (pos2 > 0)
            displayNumber = display.mid(pos, pos2 - pos);
         else
            displayNumber = display.mid(pos);
    }

    qCDebug(lcQpaInputMethods) << "host=" << host << "displayNumber" << displayNumber;

    return QStandardPaths::writableLocation(QStandardPaths::ConfigLocation) +
               "/ibus/bus/"_L1 +
               QLatin1StringView(QDBusConnection::localMachineId()) +
               u'-' + QString::fromLocal8Bit(host) + u'-' + QString::fromLocal8Bit(displayNumber);
}